

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float y_;
  float z_;
  Texture2DArrayView TVar12;
  float local_32c;
  float local_2fc;
  Vec4 local_2c8;
  undefined1 local_2b5;
  bool isOk;
  Vec2 local_2ac;
  Vec2 local_2a4;
  Vec2 clampedLod;
  Vec2 lodO;
  Vector<float,_2> local_28c;
  Vec2 coordDyo;
  Vector<float,_2> local_27c;
  Vec2 coordDxo;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  Vector<float,_2> local_250;
  Vec2 coordDy;
  Vector<float,_2> local_240;
  Vec2 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  Vector<float,_4> local_1f8;
  Vector<bool,_4> local_1e8;
  undefined1 local_1e4 [16];
  Vector<float,_4> local_1d4;
  undefined1 local_1c4 [8];
  Vec4 refPix;
  Vector<float,_4> local_1a4;
  undefined1 local_194 [8];
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_168;
  Vec2 lodOffsets [4];
  int numFailed;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_118 [8];
  Vec3 triR [2];
  undefined1 local_f8 [8];
  Vec3 triT [2];
  undefined1 local_d8 [8];
  Vec3 triS [2];
  Vector<float,_2> local_b4;
  Vec2 srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  undefined1 local_60 [8];
  Texture2DArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture2DArrayView *baseView_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar12 = tcu::getEffectiveTextureView
                     (baseView,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                *)&src.m_levels,&sampleParams->sampler);
  src._0_8_ = TVar12.m_levels;
  local_60._0_4_ = TVar12.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar5 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar4,iVar5);
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  srcSize.m_data[1] = (float)iVar4;
  iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  srcSize.m_data[0] = (float)iVar4;
  iVar4 = tcu::Texture2DArrayView::getWidth((Texture2DArrayView *)local_60);
  iVar5 = tcu::Texture2DArrayView::getHeight((Texture2DArrayView *)local_60);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(triS[1].m_data + 2),iVar4,iVar5);
  tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_b4);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_d8,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_f8,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_118,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_2fc = 0.0;
  }
  else {
    local_2fc = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffffec0,local_2fc);
  lodOffsets[3].m_data[1] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_168,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  for (resPix.m_data[3] = 0.0; fVar1 = resPix.m_data[3],
      iVar4 = tcu::ConstPixelBufferAccess::getHeight(result), fVar2 = lodOffsets[3].m_data[1],
      (int)fVar1 < iVar4; resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1)) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    for (resPix.m_data[2] = 0.0; fVar1 = resPix.m_data[2],
        iVar4 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar1 < iVar4;
        resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_1a4,(Vector<float,_4> *)(refPix.m_data + 2),
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_194,&local_1a4,&(sampleParams->super_RenderParams).colorScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1e4,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_1d4,(Vector<float,_4> *)local_1e4,
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_1c4,&local_1d4,&(sampleParams->super_RenderParams).colorScale);
      tcu::operator-((tcu *)&wy,(Vector<float,_4> *)local_194,(Vector<float,_4> *)local_1c4);
      tcu::abs<float,4>((tcu *)&local_1f8,(Vector<float,_4> *)&wy);
      tcu::lessThanEqual<float,4>((tcu *)&local_1e8,&local_1f8,&lookupPrec->colorThreshold);
      bVar3 = tcu::boolAll<4>(&local_1e8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fVar8 = (float)(int)resPix.m_data[2] + 0.5;
        fVar9 = (float)(int)resPix.m_data[3] + 0.5;
        fVar10 = fVar8 / srcSize.m_data[1];
        local_32c = fVar9 / srcSize.m_data[0];
        uVar6 = (uint)(1.0 <= fVar10 + local_32c);
        fVar1 = fVar9;
        fVar2 = fVar8;
        if (uVar6 != 0) {
          fVar10 = 1.0 - fVar10;
          local_32c = 1.0 - local_32c;
          fVar1 = srcSize.m_data[0] - fVar9;
          fVar2 = srcSize.m_data[1] - fVar8;
        }
        fVar11 = projectedTriInterpolate
                           ((Vec3 *)(triS[(long)(int)uVar6 + -1].m_data + 1),
                            (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar10,local_32c);
        y_ = projectedTriInterpolate
                       ((Vec3 *)(triT[(long)(int)uVar6 + -1].m_data + 1),
                        (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar10,local_32c);
        z_ = projectedTriInterpolate
                       ((Vec3 *)(triR[(long)(int)uVar6 + -1].m_data + 1),
                        (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar10,local_32c);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&coordDx,fVar11,y_,z_);
        fVar11 = triDerivateX((Vec3 *)(triS[(long)(int)uVar6 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar8,
                              srcSize.m_data[1],local_32c);
        fVar8 = triDerivateX((Vec3 *)(triT[(long)(int)uVar6 + -1].m_data + 1),
                             (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar8,
                             srcSize.m_data[1],local_32c);
        tcu::Vector<float,_2>::Vector(&coordDy,fVar11,fVar8);
        tcu::operator*((tcu *)&local_240,&coordDy,&local_b4);
        fVar8 = triDerivateY((Vec3 *)(triS[(long)(int)uVar6 + -1].m_data + 1),
                             (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar9,
                             srcSize.m_data[0],fVar10);
        fVar10 = triDerivateY((Vec3 *)(triT[(long)(int)uVar6 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar9,
                              srcSize.m_data[0],fVar10);
        tcu::Vector<float,_2>::Vector(&lodBounds,fVar8,fVar10);
        tcu::operator*((tcu *)&local_250,&lodBounds,&local_b4);
        fVar10 = tcu::Vector<float,_2>::x(&local_240);
        fVar8 = tcu::Vector<float,_2>::y(&local_240);
        fVar9 = tcu::Vector<float,_2>::x(&local_250);
        fVar11 = tcu::Vector<float,_2>::y(&local_250);
        tcu::computeLodBoundsFromDerivates((tcu *)&wxo,fVar10,fVar8,fVar9,fVar11,lodPrec);
        for (wyo = 0.0; (int)wyo < 4; wyo = (float)((int)wyo + 1)) {
          fVar10 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
          fVar10 = fVar2 + fVar10;
          fVar8 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
          fVar8 = fVar1 + fVar8;
          coordDxo.m_data[1] = fVar10 / srcSize.m_data[1];
          coordDxo.m_data[0] = fVar8 / srcSize.m_data[0];
          fVar9 = triDerivateX((Vec3 *)(triS[(long)(int)uVar6 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar10,
                               srcSize.m_data[1],coordDxo.m_data[0]);
          fVar10 = triDerivateX((Vec3 *)(triT[(long)(int)uVar6 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar10,
                                srcSize.m_data[1],coordDxo.m_data[0]);
          tcu::Vector<float,_2>::Vector(&coordDyo,fVar9,fVar10);
          tcu::operator*((tcu *)&local_27c,&coordDyo,&local_b4);
          fVar10 = triDerivateY((Vec3 *)(triS[(long)(int)uVar6 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar8,
                                srcSize.m_data[0],coordDxo.m_data[1]);
          fVar8 = triDerivateY((Vec3 *)(triT[(long)(int)uVar6 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar6 * 0xc),fVar8,
                               srcSize.m_data[0],coordDxo.m_data[1]);
          tcu::Vector<float,_2>::Vector(&lodO,fVar10,fVar8);
          tcu::operator*((tcu *)&local_28c,&lodO,&local_b4);
          fVar10 = tcu::Vector<float,_2>::x(&local_27c);
          fVar8 = tcu::Vector<float,_2>::y(&local_27c);
          fVar9 = tcu::Vector<float,_2>::x(&local_28c);
          fVar11 = tcu::Vector<float,_2>::y(&local_28c);
          tcu::computeLodBoundsFromDerivates((tcu *)&clampedLod,fVar10,fVar8,fVar9,fVar11,lodPrec);
          pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
          fVar10 = *pfVar7;
          fVar8 = tcu::Vector<float,_2>::x(&clampedLod);
          fVar10 = de::min<float>(fVar10,fVar8);
          pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
          *pfVar7 = fVar10;
          pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
          fVar10 = *pfVar7;
          fVar8 = tcu::Vector<float,_2>::y(&clampedLod);
          fVar10 = de::max<float>(fVar10,fVar8);
          pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
          *pfVar7 = fVar10;
        }
        tcu::operator+((tcu *)&local_2ac,(Vector<float,_2> *)&wxo,
                       (Vector<float,_2> *)&stack0xfffffffffffffec0);
        tcu::Vector<float,_2>::Vector
                  ((Vector<float,_2> *)&stack0xfffffffffffffd4c,sampleParams->minLod,
                   sampleParams->maxLod);
        tcu::clampLodBounds((tcu *)&local_2a4,&local_2ac,(Vec2 *)&stack0xfffffffffffffd4c,lodPrec);
        local_2b5 = tcu::isLookupResultValid
                              ((Texture2DArrayView *)local_60,&sampleParams->sampler,lookupPrec,
                               (Vec3 *)&coordDx,&local_2a4,(Vec4 *)local_194);
        if (!(bool)local_2b5) {
          tcu::RGBA::red();
          tcu::RGBA::toVec((RGBA *)&local_2c8);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_2c8,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
          lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
        }
      }
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return (int)fVar2;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::Vec2								srcSize				= tcu::IVec2(src.getWidth(), src.getHeight()).asFloat(); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize;
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize;
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}